

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::PrintFullTestCommentIfPresent(TestInfo *test_info)

{
  char *pcVar1;
  char *pcVar2;
  char *value_param;
  char *type_param;
  TestInfo *test_info_local;
  
  pcVar1 = TestInfo::type_param(test_info);
  pcVar2 = TestInfo::value_param(test_info);
  if ((pcVar1 != (char *)0x0) || (pcVar2 != (char *)0x0)) {
    printf(", where ");
    if ((pcVar1 != (char *)0x0) && (printf("%s = %s","TypeParam",pcVar1), pcVar2 != (char *)0x0)) {
      printf(" and ");
    }
    if (pcVar2 != (char *)0x0) {
      printf("%s = %s","GetParam()",pcVar2);
    }
  }
  return;
}

Assistant:

void PrintFullTestCommentIfPresent(const TestInfo& test_info) {
  const char* const type_param = test_info.type_param();
  const char* const value_param = test_info.value_param();

  if (type_param != NULL || value_param != NULL) {
    printf(", where ");
    if (type_param != NULL) {
      printf("%s = %s", kTypeParamLabel, type_param);
      if (value_param != NULL)
        printf(" and ");
    }
    if (value_param != NULL) {
      printf("%s = %s", kValueParamLabel, value_param);
    }
  }
}